

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O0

X509_NAME_ENTRY * X509_NAME_delete_entry(X509_NAME *name,int loc)

{
  stack_st_X509_NAME_ENTRY *sk_00;
  size_t sVar1;
  X509_NAME_ENTRY *pXVar2;
  ulong local_48;
  size_t i;
  int set_next;
  int set_prev;
  size_t n;
  X509_NAME_ENTRY *ret;
  stack_st_X509_NAME_ENTRY *sk;
  int loc_local;
  X509_NAME *name_local;
  
  if (((name == (X509_NAME *)0x0) || (loc < 0)) ||
     (sVar1 = sk_X509_NAME_ENTRY_num((stack_st_X509_NAME_ENTRY *)name->entries),
     sVar1 <= (ulong)(long)loc)) {
    name_local = (X509_NAME *)0x0;
  }
  else {
    sk_00 = (stack_st_X509_NAME_ENTRY *)name->entries;
    name_local = (X509_NAME *)sk_X509_NAME_ENTRY_delete(sk_00,(long)loc);
    sVar1 = sk_X509_NAME_ENTRY_num(sk_00);
    name->modified = 1;
    if ((long)loc != sVar1) {
      if (loc == 0) {
        i._4_4_ = *(int *)&name_local->bytes + -1;
      }
      else {
        pXVar2 = sk_X509_NAME_ENTRY_value(sk_00,(long)(loc + -1));
        i._4_4_ = pXVar2->set;
      }
      pXVar2 = sk_X509_NAME_ENTRY_value(sk_00,(long)loc);
      if (i._4_4_ + 1 < pXVar2->set) {
        for (local_48 = (ulong)loc; local_48 < sVar1; local_48 = local_48 + 1) {
          pXVar2 = sk_X509_NAME_ENTRY_value(sk_00,local_48);
          pXVar2->set = pXVar2->set + -1;
        }
      }
    }
  }
  return (X509_NAME_ENTRY *)name_local;
}

Assistant:

X509_NAME_ENTRY *X509_NAME_delete_entry(X509_NAME *name, int loc) {
  if (name == NULL || loc < 0 ||
      sk_X509_NAME_ENTRY_num(name->entries) <= (size_t)loc) {
    return NULL;
  }

  STACK_OF(X509_NAME_ENTRY) *sk = name->entries;
  X509_NAME_ENTRY *ret = sk_X509_NAME_ENTRY_delete(sk, loc);
  size_t n = sk_X509_NAME_ENTRY_num(sk);
  name->modified = 1;
  if ((size_t)loc == n) {
    return ret;
  }

  int set_prev;
  if (loc != 0) {
    set_prev = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set;
  } else {
    set_prev = ret->set - 1;
  }
  int set_next = sk_X509_NAME_ENTRY_value(sk, loc)->set;

  // If we removed a singleton RDN, update the RDN indices so they are
  // consecutive again.
  if (set_prev + 1 < set_next) {
    for (size_t i = loc; i < n; i++) {
      sk_X509_NAME_ENTRY_value(sk, i)->set--;
    }
  }
  return ret;
}